

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

int __thiscall cvm::BasicValue::toInt(BasicValue *this)

{
  int iVar1;
  
  switch(this->Type) {
  case BoolType:
    return (int)(this->field_2).BoolVal;
  case IntType:
    return (this->field_2).IntVal;
  case DoubleType:
    return (int)(this->field_2).DoubleVal;
  case StringType:
    iVar1 = std::__cxx11::stoi(&this->StrVal,(size_t *)0x0,10);
    return iVar1;
  default:
    return 0;
  }
}

Assistant:

int BasicValue::toInt() const {
  switch (Type) {
  default:          return 0;
  case IntType:     return IntVal;
  case DoubleType:  return static_cast<int>(DoubleVal);
  case BoolType:    return BoolVal;
  case StringType:  return std::stoi(StrVal);
  }
}